

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_helper_polar<ExchCXX::BuiltinR2SCAN_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  double dVar1;
  long lVar2;
  const_host_buffer_type pdVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  
  if (0 < N) {
    pdVar3 = sigma + 2;
    lVar2 = 0;
    do {
      auVar5 = *(undefined1 (*) [16])((long)rho + lVar2 * 2);
      if (auVar5._8_8_ + auVar5._0_8_ <= 1e-11) {
        *(double *)((long)eps + lVar2) = 0.0;
      }
      else {
        auVar9 = maxpd(_DAT_01025200,*(undefined1 (*) [16])((long)tau + lVar2 * 2));
        auVar7._8_8_ = *pdVar3;
        auVar7._0_8_ = pdVar3[-2];
        auVar5 = maxpd(_DAT_01025220,auVar5);
        auVar7 = maxpd(_DAT_01025230,auVar7);
        auVar6._0_8_ = auVar5._0_8_ * 8.0 * auVar9._0_8_;
        auVar6._8_8_ = auVar5._8_8_ * 8.0 * auVar9._8_8_;
        auVar6 = minpd(auVar6,auVar7);
        dVar8 = (auVar6._8_8_ + auVar6._0_8_) * 0.5;
        uVar4 = -(ulong)(-dVar8 <= pdVar3[-1]);
        dVar1 = (double)(uVar4 & (ulong)pdVar3[-1] | ~uVar4 & (ulong)-dVar8);
        uVar4 = -(ulong)(dVar1 <= dVar8);
        kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_polar_impl
                  (auVar5._0_8_,auVar5._8_8_,auVar6._0_8_,
                   (double)(~uVar4 & (ulong)dVar8 | uVar4 & (ulong)dVar1),auVar6._8_8_,0.0,0.0,
                   auVar9._0_8_,auVar9._8_8_,(double *)((long)eps + lVar2));
      }
      pdVar3 = pdVar3 + 3;
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)N << 3 != lVar2);
  }
  return;
}

Assistant:

MGGA_EXC_GENERATOR( host_eval_exc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;
    auto* tau_i   = tau   + 2*i;
    auto* lapl_i  = lapl  + 2*i;

    const auto lapl_i_a = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const auto lapl_i_b = traits::needs_laplacian ? lapl_i[1] : 0.0;
   
    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_i_a, lapl_i_b, tau_i[0], tau_i[1], 
      eps[i] );

  }

}